

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  undefined2 uVar1;
  char *__dest;
  ulong uVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  StrAccum local_48;
  
  if (pMem->szMalloc < 0x20) {
    iVar5 = sqlite3VdbeMemGrow(pMem,0x20,0);
    if (iVar5 != 0) {
      pMem->enc = '\0';
      return 7;
    }
  }
  else {
    pMem->z = pMem->zMalloc;
    pMem->flags = pMem->flags & 0x2d;
  }
  __dest = pMem->z;
  if ((pMem->flags & 4) == 0) {
    local_48.db = (sqlite3 *)0x0;
    local_48.nAlloc = 0x20;
    local_48.mxAlloc = 0;
    local_48.nChar = 0;
    local_48.accError = '\0';
    local_48.printfFlags = '\0';
    if ((pMem->flags & 0x20) == 0) {
      dVar10 = (pMem->u).r;
    }
    else {
      dVar10 = (double)(pMem->u).i;
    }
    local_48.zText = __dest;
    sqlite3_str_appendf(&local_48,"%!.15g",dVar10);
    __dest[(ulong)local_48._20_8_ >> 0x20] = '\0';
  }
  else {
    uVar2 = (pMem->u).i;
    uVar7 = -uVar2;
    if (0 < (long)uVar2) {
      uVar7 = uVar2;
    }
    local_48.mxAlloc._0_2_ = (ushort)(byte)local_48.mxAlloc;
    lVar8 = 0x14;
    iVar5 = 0x13;
    lVar9 = 0x1400000000;
    do {
      lVar9 = lVar9 + -0x100000000;
      *(byte *)((long)&local_48.db + lVar8) = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
      lVar8 = lVar8 + -1;
      iVar5 = iVar5 + -1;
      bVar3 = 9 < uVar7;
      uVar7 = uVar7 / 10;
    } while (bVar3);
    if ((long)uVar2 < 0) {
      *(undefined1 *)((long)&local_48.db + (lVar9 >> 0x20)) = 0x2d;
    }
    else {
      iVar5 = (int)lVar8;
    }
    memcpy(__dest,(void *)((long)&local_48.db + (long)iVar5 + 1),0x15 - (long)iVar5);
  }
  sVar6 = strlen(pMem->z);
  pMem->n = (uint)sVar6 & 0x3fffffff;
  pMem->enc = '\x01';
  uVar1 = pMem->flags;
  uVar4 = uVar1 & 0xffd3;
  if (bForce == '\0') {
    uVar4 = uVar1;
  }
  pMem->flags = uVar4 | 0x202;
  if (enc != '\x01') {
    sqlite3VdbeMemTranslate(pMem,enc);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  const int nByte = 32;

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(pMem->flags&MEM_Zero) );
  assert( !(pMem->flags&(MEM_Str|MEM_Blob)) );
  assert( pMem->flags&(MEM_Int|MEM_Real|MEM_IntReal) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  vdbeMemRenderNum(nByte, pMem->z, pMem);
  assert( pMem->z!=0 );
  pMem->n = sqlite3Strlen30NN(pMem->z);
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}